

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint
          (btGeneric6DofSpringConstraint *this,btRigidBody *rbB,btTransform *frameInB,
          bool useLinearReferenceFrameB)

{
  EVP_PKEY_CTX *in_RSI;
  btGeneric6DofSpringConstraint *in_RDI;
  bool in_stack_0000008f;
  btTransform *in_stack_00000090;
  btRigidBody *in_stack_00000098;
  btGeneric6DofConstraint *in_stack_000000a0;
  
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008f);
  (in_RDI->super_btGeneric6DofConstraint).super_btTypedConstraint._vptr_btTypedConstraint =
       (_func_int **)&PTR__btGeneric6DofSpringConstraint_002e7128;
  init(in_RDI,in_RSI);
  return;
}

Assistant:

btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint(btRigidBody& rbB, const btTransform& frameInB, bool useLinearReferenceFrameB)
        : btGeneric6DofConstraint(rbB, frameInB, useLinearReferenceFrameB)
{
    init();
}